

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

string * __thiscall Block::GetHash_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_bHash);
  return __return_storage_ptr__;
}

Assistant:

string Block::GetHash()
{
	return _bHash;
}